

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm_suite.cpp
# Opt level: O1

void push_heap_suite::push_increasing_custom(void)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  int __tmp;
  ulong uVar4;
  int __tmp_2;
  ulong uVar5;
  array<int,_5UL> heap;
  uint local_44 [3];
  array<int,_5UL> expect;
  int local_24;
  
  heap._M_elems[2] = 0;
  heap._M_elems[3] = 0;
  heap._M_elems[4] = 0;
  heap._M_elems[0] = 0xb;
  heap._M_elems[1] = 0;
  expect._M_elems[0] = 0xb;
  expect._M_elems[1] = 0;
  expect._M_elems[2] = 0;
  expect._M_elems[3] = 0;
  expect._M_elems[4] = 0;
  boost::detail::test_all_eq_impl<std::ostream,int*,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0x79,"void push_heap_suite::push_increasing_custom()",heap._M_elems,(int *)local_44,
             expect._M_elems,&local_24);
  iVar3 = heap._M_elems[0];
  heap._M_elems[1] = 0x16;
  if ((int)(heap._M_elems[0] ^ 0x55555555U) < 0x55555543) {
    heap._M_elems[0] = 0x16;
    heap._M_elems[1] = iVar3;
  }
  expect._M_elems[0] = 0xb;
  expect._M_elems[1] = 0x16;
  expect._M_elems[2] = 0;
  expect._M_elems[3] = 0;
  expect._M_elems[4] = 0;
  boost::detail::test_all_eq_impl<std::ostream,int*,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0x80,"void push_heap_suite::push_increasing_custom()",heap._M_elems,(int *)local_44,
             expect._M_elems,&local_24);
  iVar3 = heap._M_elems[0];
  heap._M_elems[2] = 0x21;
  if ((int)(heap._M_elems[0] ^ 0x55555555U) < 0x55555574) {
    heap._M_elems[0] = 0x21;
    heap._M_elems[2] = iVar3;
  }
  expect._M_elems[0] = 0x21;
  expect._M_elems[1] = 0x16;
  expect._M_elems[2] = 0xb;
  expect._M_elems[3] = 0;
  expect._M_elems[4] = 0;
  boost::detail::test_all_eq_impl<std::ostream,int*,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0x87,"void push_heap_suite::push_increasing_custom()",heap._M_elems,(int *)local_44,
             expect._M_elems,&local_24);
  heap._M_elems[3] = 0x2c;
  uVar4 = 4;
  uVar5 = 2;
  do {
    uVar1 = local_44[uVar5 - 6];
    if ((int)(local_44[uVar4 - 6] ^ 0x55555555) <= (int)(uVar1 ^ 0x55555555)) break;
    local_44[uVar5 - 6] = local_44[uVar4 - 6];
    local_44[uVar4 - 6] = uVar1;
    bVar2 = 1 < uVar5;
    uVar4 = uVar5;
    uVar5 = uVar5 >> 1;
  } while (bVar2);
  expect._M_elems[0] = 0x2c;
  expect._M_elems[1] = 0x21;
  expect._M_elems[2] = 0xb;
  expect._M_elems[3] = 0x16;
  expect._M_elems[4] = 0;
  boost::detail::test_all_eq_impl<std::ostream,int*,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0x8e,"void push_heap_suite::push_increasing_custom()",heap._M_elems,(int *)local_44,
             expect._M_elems,&local_24);
  heap._M_elems[4] = 0x37;
  uVar4 = 5;
  uVar5 = 2;
  do {
    uVar1 = local_44[uVar5 - 6];
    if ((int)(local_44[uVar4 - 6] ^ 0x55555555) <= (int)(uVar1 ^ 0x55555555)) break;
    local_44[uVar5 - 6] = local_44[uVar4 - 6];
    local_44[uVar4 - 6] = uVar1;
    bVar2 = 1 < uVar5;
    uVar4 = uVar5;
    uVar5 = uVar5 >> 1;
  } while (bVar2);
  expect._M_elems[0] = 0x2c;
  expect._M_elems[1] = 0x21;
  expect._M_elems[2] = 0xb;
  expect._M_elems[3] = 0x16;
  expect._M_elems[4] = 0x37;
  boost::detail::test_all_eq_impl<std::ostream,int*,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0x95,"void push_heap_suite::push_increasing_custom()",heap._M_elems,(int *)local_44,
             expect._M_elems,&local_24);
  return;
}

Assistant:

void push_increasing_custom()
{
    xless<int, 0x55555555> custom;

    std::array<int, 5> heap = {};
    auto last = heap.begin();
    *last++ = 11;
    vista::push_heap(heap.begin(), last, custom);
    {
        std::array<int, 5> expect = { 11, 0, 0, 0, 0 };
        BOOST_TEST_ALL_EQ(heap.begin(), heap.end(),
                          expect.begin(), expect.end());
    }
    *last++ = 22;
    vista::push_heap(heap.begin(), last, custom);
    {
        std::array<int, 5> expect = { 11, 22, 0, 0, 0 };
        BOOST_TEST_ALL_EQ(heap.begin(), heap.end(),
                          expect.begin(), expect.end());
    }
    *last++ = 33;
    vista::push_heap(heap.begin(), last, custom);
    {
        std::array<int, 5> expect = { 33, 22, 11, 0, 0 };
        BOOST_TEST_ALL_EQ(heap.begin(), heap.end(),
                          expect.begin(), expect.end());
    }
    *last++ = 44;
    vista::push_heap(heap.begin(), last, custom);
    {
        std::array<int, 5> expect = { 44, 33, 11, 22, 0 };
        BOOST_TEST_ALL_EQ(heap.begin(), heap.end(),
                          expect.begin(), expect.end());
    }
    *last++ = 55;
    vista::push_heap(heap.begin(), last, custom);
    {
        std::array<int, 5> expect = { 44, 33, 11, 22, 55 };
        BOOST_TEST_ALL_EQ(heap.begin(), heap.end(),
                          expect.begin(), expect.end());
    }
}